

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void cmp_D9(void)

{
  ubyte uVar1;
  ubyte uVar2;
  
  except = '\0';
  uVar1 = getbyte(pc);
  uVar2 = getbyte(pc + 1);
  temp1 = getbyte((ushort)y_reg + CONCAT11(uVar2,uVar1));
  _AL = acc;
  _AH = temp1;
  carry_f = '\x01';
  result_f = '@';
  pc = pc + 2;
  return;
}

Assistant:

void cmp_D9(void) {
    uint flags;
    CLE;
    temp1 = getbyte(getbyte(pc) + 0x100 * getbyte(pc + 1) + y_reg);

    asm("push ax");

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("cmp AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("pop AX");

    carry_f = (flags & 1) ^ 1;
    result_f = flags & 0xC0;
    result_f ^= 0x40;

    pc += 2;
}